

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void __thiscall Json::Reader::Reader(Reader *this,Features *features)

{
  std::stack<Json::Value*,std::deque<Json::Value*,std::allocator<Json::Value*>>>::
  stack<std::deque<Json::Value*,std::allocator<Json::Value*>>,void>(&this->nodes_);
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->errors_).
  super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::_Deque_base
            (&(this->errors_).
              super__Deque_base<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>);
  (this->document_)._M_dataplus._M_p = (pointer)&(this->document_).field_2;
  (this->document_)._M_string_length = 0;
  (this->document_).field_2._M_local_buf[0] = '\0';
  this->begin_ = (Location)0x0;
  this->end_ = (Location)0x0;
  this->current_ = (Location)0x0;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  (this->commentsBefore_)._M_dataplus._M_p = (pointer)&(this->commentsBefore_).field_2;
  (this->commentsBefore_)._M_string_length = 0;
  (this->commentsBefore_).field_2._M_local_buf[0] = '\0';
  this->features_ = *features;
  this->collectComments_ = false;
  return;
}

Assistant:

Reader::Reader( const Features &features )
    : errors_(),
      document_(),
      begin_(),
      end_(),
      current_(),
      lastValueEnd_(),
      lastValue_(),
      commentsBefore_(),
      features_( features ),
      collectComments_()
{
}